

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

void bgr_555_to_abgr_8888
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  uint *puVar1;
  ushort uVar2;
  uint *puVar3;
  ushort *puVar4;
  int iVar5;
  int iVar6;
  
  if (0 < height) {
    puVar3 = (uint *)((long)dst + (long)dx * 4 + (long)(dy * dst_pitch));
    puVar4 = (ushort *)((long)src + (long)sx * 2 + (long)(sy * src_pitch));
    iVar5 = dst_pitch + 3;
    if (-1 < dst_pitch) {
      iVar5 = dst_pitch;
    }
    iVar6 = 0;
    do {
      if (0 < width) {
        puVar1 = puVar3 + width;
        do {
          uVar2 = *puVar4;
          *puVar3 = *(int *)((long)_al_rgb_scale_5 + (ulong)(uVar2 >> 3 & 0x7c)) << 8 |
                    *(int *)((long)_al_rgb_scale_5 + (ulong)(uVar2 >> 8 & 0x7c)) << 0x10 |
                    _al_rgb_scale_5[uVar2 & 0x1f] | 0xff000000;
          puVar3 = puVar3 + 1;
          puVar4 = puVar4 + 1;
        } while (puVar3 < puVar1);
      }
      puVar4 = puVar4 + (src_pitch / 2 - width);
      puVar3 = puVar3 + ((iVar5 >> 2) - width);
      iVar6 = iVar6 + 1;
    } while (iVar6 != height);
  }
  return;
}

Assistant:

static void bgr_555_to_abgr_8888(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint16_t *src_ptr = (const uint16_t *)((const char *)src + sy * src_pitch);
   uint32_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 2 - width;
   int dst_gap = dst_pitch / 4 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint32_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_BGR_555_TO_ABGR_8888(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}